

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

BOOL Js::JavascriptArray::GetParamForLastIndexOf
               (int64 length,Arguments *args,Var *search,int64 *fromIndex,
               ScriptContext *scriptContext)

{
  Var pvVar1;
  int64 iVar2;
  JavascriptLibrary *this;
  RecyclableObject *local_40;
  ScriptContext *scriptContext_local;
  int64 *fromIndex_local;
  Var *search_local;
  Arguments *args_local;
  int64 length_local;
  
  if (length == 0) {
    length_local._4_4_ = 0;
  }
  else {
    if ((SUB84(args->Info,0) & 0xffffff) < 3) {
      if ((SUB84(args->Info,0) & 0xffffff) == 1 || ((ulong)args->Info & 0xffffff) == 0) {
        this = ScriptContext::GetLibrary(scriptContext);
        local_40 = JavascriptLibraryBase::GetUndefined(&this->super_JavascriptLibraryBase);
      }
      else {
        local_40 = (RecyclableObject *)Arguments::operator[](args,1);
      }
      *search = local_40;
      *fromIndex = length + -1;
    }
    else {
      pvVar1 = Arguments::operator[](args,2);
      iVar2 = GetFromLastIndex(pvVar1,length,scriptContext);
      *fromIndex = iVar2;
      if (length <= *fromIndex) {
        return 0;
      }
      pvVar1 = Arguments::operator[](args,1);
      *search = pvVar1;
    }
    length_local._4_4_ = 1;
  }
  return length_local._4_4_;
}

Assistant:

BOOL JavascriptArray::GetParamForLastIndexOf(int64 length, Arguments const & args, Var& search, int64& fromIndex, ScriptContext * scriptContext)
    {
        if (length == 0)
        {
            return false;
        }

        if (args.Info.Count > 2)
        {
            fromIndex = GetFromLastIndex(args[2], length, scriptContext);

            if (fromIndex >= length)
            {
                return false;
            }
            search = args[1];
        }
        else
        {
            search = args.Info.Count > 1 ? args[1] : scriptContext->GetLibrary()->GetUndefined();
            fromIndex = length - 1;
        }
        return true;
    }